

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getWindowsTimeZoneID_63
                  (UChar *id,int32_t len,UChar *winid,int32_t winidCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  Char16Ptr local_d8 [3];
  UnicodeString local_c0;
  undefined1 local_80 [8];
  UnicodeString resultWinID;
  int32_t resultLen;
  UErrorCode *status_local;
  int32_t winidCapacity_local;
  UChar *winid_local;
  int32_t len_local;
  UChar *id_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    resultWinID.fUnion._52_4_ = 0;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_80);
    icu_63::UnicodeString::UnicodeString(&local_c0,id,len);
    icu_63::TimeZone::getWindowsID(&local_c0,(UnicodeString *)local_80,status);
    icu_63::UnicodeString::~UnicodeString(&local_c0);
    UVar1 = U_SUCCESS(*status);
    if (UVar1 != '\0') {
      iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_80);
      if (0 < iVar2) {
        resultWinID.fUnion._52_4_ = icu_63::UnicodeString::length((UnicodeString *)local_80);
        icu_63::Char16Ptr::Char16Ptr(local_d8,winid);
        icu_63::UnicodeString::extract((UnicodeString *)local_80,local_d8,winidCapacity,status);
        icu_63::Char16Ptr::~Char16Ptr(local_d8);
      }
    }
    id_local._4_4_ = resultWinID.fUnion._52_4_;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_80);
  }
  else {
    id_local._4_4_ = 0;
  }
  return id_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getWindowsTimeZoneID(const UChar* id, int32_t len, UChar* winid, int32_t winidCapacity, UErrorCode* status) {
    if (U_FAILURE(*status)) {
        return 0;
    }

    int32_t resultLen = 0;
    UnicodeString resultWinID;

    TimeZone::getWindowsID(UnicodeString(id, len), resultWinID, *status);
    if (U_SUCCESS(*status) && resultWinID.length() > 0) {
        resultLen = resultWinID.length();
        resultWinID.extract(winid, winidCapacity, *status);
    }

    return resultLen;
}